

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_compareIgnoreCase(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  ushort uVar1;
  int iVar2;
  ushort *puVar3;
  
  if (getp_compareIgnoreCase(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_compareIgnoreCase();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_compareIgnoreCase::desc);
  if (iVar2 == 0) {
    uVar1 = *(ushort *)str;
    puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar3 == (ushort *)0x0) {
      err_throw(0x7e3);
    }
    iVar2 = t3_compare_case_fold
                      (str + 2,(ulong)uVar1,(char *)(puVar3 + 1),(ulong)*puVar3,(size_t *)0x0);
    retval->typ = VM_INT;
    (retval->val).intval = iVar2;
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_compareIgnoreCase(VMG_ vm_val_t *retval,
                                         const vm_val_t *self_val,
                                         const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* get the other string (leave it on the stack for gc protection) */
    const char *other = G_stk->get(0)->get_as_string(vmg0_);
    if (other == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get its buffer and length */
    size_t olen = vmb_get_len(other);
    other += VMB_LEN;

    /* compare the strings */
    retval->set_int(t3_compare_case_fold(str, len, other, olen, 0));

    /* discard arguments */
    G_stk->discard(1);

    /* done */
    return TRUE;
}